

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

int __thiscall phosg::Poll::remove(Poll *this,char *__filename)

{
  const_iterator cVar1;
  int iVar2;
  iterator iVar3;
  char in_DL;
  ulong uVar4;
  const_iterator __position;
  ulong uVar5;
  
  cVar1._M_current =
       (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
       super__Vector_impl_data._M_start;
  iVar3._M_current =
       (this->poll_fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar5 = (long)iVar3._M_current - (long)cVar1._M_current >> 3;
  while (__position._M_current = cVar1._M_current, iVar2 = (int)__filename, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    cVar1._M_current = __position._M_current + uVar4 + 1;
    if (iVar2 <= __position._M_current[uVar4].fd) {
      uVar5 = uVar4;
      cVar1._M_current = __position._M_current;
    }
  }
  if (((__position._M_current != iVar3._M_current) && ((__position._M_current)->fd == iVar2)) &&
     (iVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::erase
                        ((vector<pollfd,_std::allocator<pollfd>_> *)this,__position), in_DL != '\0')
     ) {
    iVar2 = close(iVar2);
    return iVar2;
  }
  return (int)iVar3._M_current;
}

Assistant:

void Poll::remove(int fd, bool close_fd) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  auto erase_it = lower_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (erase_it != this->poll_fds.end() && erase_it->fd == fd) {
    this->poll_fds.erase(erase_it);
    if (close_fd) {
      close(fd);
    }
  }
}